

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo,int eDistinctType)

{
  Vdbe *p;
  Expr *pEVar1;
  ExprList *pList;
  ExprList *pList_00;
  FuncDef *p_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  CollSeq *zP4;
  Op *pOVar5;
  Expr **ppEVar6;
  int iVar7;
  AggInfo_func *pAVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ExprList_item *pEVar14;
  int local_7c;
  int local_68;
  int local_40;
  
  if (pParse->nErr != 0) {
    return;
  }
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  if (pAggInfo->nFunc < 1) {
LAB_0018ff77:
    iVar13 = pAggInfo->nAccumulator;
    iVar12 = 0;
    local_68 = regAcc;
    if (regAcc == 0 || iVar13 == 0) goto LAB_0018ffa9;
  }
  else {
    pAVar8 = pAggInfo->aFunc;
    iVar13 = 0;
    local_68 = 0;
    do {
      pEVar1 = pAVar8->pFExpr;
      pList = (pEVar1->x).pList;
      if ((pEVar1->flags & 0x1000000) == 0) {
        local_7c = 0;
      }
      else {
        pEVar1 = ((pEVar1->y).pWin)->pFilter;
        if (((pAggInfo->nAccumulator != 0) && (regAcc != 0)) &&
           ((pAVar8->pFunc->funcFlags & 0x20) != 0)) {
          if (local_68 == 0) {
            local_68 = pParse->nMem + 1;
            pParse->nMem = local_68;
          }
          sqlite3VdbeAddOp3(p,0x50,regAcc,local_68,0);
        }
        local_7c = pParse->nLabel + -1;
        pParse->nLabel = local_7c;
        sqlite3ExprIfFalse(pParse,pEVar1,local_7c,0x10);
      }
      if (pAVar8->iOBTab < 0) {
        if (pList != (ExprList *)0x0) {
          iVar12 = pList->nExpr;
          local_40 = sqlite3GetTempRange(pParse,iVar12);
          iVar9 = 0;
          sqlite3ExprCodeExprList(pParse,pList,local_40,0,'\x01');
          iVar3 = local_40;
          goto LAB_0018fc8c;
        }
        iVar3 = 0;
        iVar12 = 0;
        if ((pAVar8->pFunc->funcFlags & 0x20) != 0) goto LAB_0018fe0f;
LAB_0018fe6c:
        sqlite3VdbeAddOp3(p,0xa2,0,iVar3,pAggInfo->iFirstReg + iVar13 + pAggInfo->nColumn);
        p_00 = pAVar8->pFunc;
        if (p->db->mallocFailed == '\0') {
          pOVar5 = p->aOp;
          iVar9 = p->nOp;
          pOVar5[(long)iVar9 + -1].p4type = -7;
          pOVar5[(long)iVar9 + -1].p4.pKeyInfo = (KeyInfo *)p_00;
        }
        else if ((p_00->funcFlags & 0x10) != 0) {
          sqlite3DbNNFreeNN(p->db,p_00);
        }
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (u16)iVar12;
        }
        if (iVar12 == 1) {
          if ((iVar3 != 0) && (uVar4 = (ulong)pParse->nTempReg, uVar4 < 8)) goto LAB_0018ff09;
        }
        else if (pParse->nRangeReg < iVar12) {
          pParse->nRangeReg = iVar12;
          pParse->iRangeReg = iVar3;
        }
      }
      else {
        iVar12 = pList->nExpr;
        iVar9 = iVar12;
        if (pAVar8->bOBPayload == '\0') {
          iVar9 = 0;
        }
        pList_00 = (pAVar8->pFExpr->pLeft->x).pList;
        iVar3 = iVar12;
        if (pAVar8->bUseSubtype == '\0') {
          iVar3 = 0;
        }
        iVar9 = iVar9 + pList_00->nExpr + (uint)(pAVar8->bOBUnique == '\0') + iVar3 + 1;
        iVar3 = sqlite3GetTempRange(pParse,iVar9);
        sqlite3ExprCodeExprList(pParse,pList_00,iVar3,0,'\x01');
        iVar10 = pList_00->nExpr;
        if (pAVar8->bOBUnique == '\0') {
          sqlite3VdbeAddOp3(p,0x7e,pAVar8->iOBTab,iVar10 + iVar3,0);
          iVar10 = iVar10 + 1;
        }
        local_40 = iVar3;
        if (pAVar8->bOBPayload != '\0') {
          local_40 = iVar10 + iVar3;
          sqlite3ExprCodeExprList(pParse,pList,local_40,0,'\x01');
          iVar10 = iVar10 + iVar12;
        }
        if (pAVar8->bUseSubtype != '\0') {
          iVar7 = local_40;
          if (pAVar8->bOBPayload == '\0') {
            iVar7 = iVar3;
          }
          if (0 < iVar12) {
            iVar11 = 0;
            do {
              sqlite3VdbeAddOp3(p,0xb5,iVar11 + iVar7,iVar3 + iVar10 + iVar11,0);
              iVar11 = iVar11 + 1;
            } while (iVar12 != iVar11);
          }
        }
LAB_0018fc8c:
        iVar10 = pAVar8->iDistinct;
        if (pList != (ExprList *)0x0 && -1 < iVar10) {
          if (local_7c == 0) {
            local_7c = pParse->nLabel + -1;
            pParse->nLabel = local_7c;
          }
          iVar10 = codeDistinct(pParse,eDistinctType,iVar10,local_7c,pList,local_40);
          pAVar8->iDistinct = iVar10;
        }
        if (pAVar8->iOBTab < 0) {
          if ((pAVar8->pFunc->funcFlags & 0x20) == 0) goto LAB_0018fe6c;
          if (iVar12 < 1) {
LAB_0018fe0f:
            zP4 = pParse->db->pDfltColl;
          }
          else {
            pEVar14 = pList->a;
            iVar9 = 1;
            do {
              zP4 = sqlite3ExprCollSeq(pParse,pEVar14->pExpr);
              if (zP4 != (CollSeq *)0x0) break;
              pEVar14 = pEVar14 + 1;
              bVar2 = iVar9 < iVar12;
              iVar9 = iVar9 + 1;
            } while (bVar2);
            if (zP4 == (CollSeq *)0x0) goto LAB_0018fe0f;
          }
          if (local_68 == 0) {
            if (pAggInfo->nAccumulator == 0) {
              local_68 = 0;
            }
            else {
              local_68 = pParse->nMem + 1;
              pParse->nMem = local_68;
            }
          }
          iVar9 = sqlite3VdbeAddOp3(p,0x55,local_68,0,0);
          sqlite3VdbeChangeP4(p,iVar9,(char *)zP4,-2);
          goto LAB_0018fe6c;
        }
        iVar12 = iVar9 + iVar3 + -1;
        sqlite3VdbeAddOp3(p,0x61,iVar3,iVar9 + -1,iVar12);
        sqlite3VdbeAddOp4Int(p,0x8a,pAVar8->iOBTab,iVar12,iVar3,iVar9 + -1);
        if (iVar9 == 1) {
          if ((iVar3 == 0) || (uVar4 = (ulong)pParse->nTempReg, 7 < uVar4)) goto LAB_0018ff43;
LAB_0018ff09:
          pParse->nTempReg = (char)uVar4 + '\x01';
          pParse->aTempReg[uVar4] = iVar3;
        }
        else if (pParse->nRangeReg < iVar9) {
          pParse->nRangeReg = iVar9;
          pParse->iRangeReg = iVar3;
        }
      }
LAB_0018ff43:
      if (local_7c != 0) {
        sqlite3VdbeResolveLabel(p,local_7c);
      }
      if (pParse->nErr != 0) {
        return;
      }
      iVar13 = iVar13 + 1;
      pAVar8 = pAVar8 + 1;
    } while (iVar13 < pAggInfo->nFunc);
    if (local_68 == 0) goto LAB_0018ff77;
  }
  iVar12 = sqlite3VdbeAddOp3(p,0x10,local_68,0,0);
  iVar13 = pAggInfo->nAccumulator;
LAB_0018ffa9:
  if (0 < iVar13) {
    ppEVar6 = &pAggInfo->aCol->pCExpr;
    iVar13 = 0;
    do {
      sqlite3ExprCode(pParse,*ppEVar6,pAggInfo->iFirstReg + iVar13);
      if (pParse->nErr != 0) {
        return;
      }
      iVar13 = iVar13 + 1;
      ppEVar6 = ppEVar6 + 3;
    } while (iVar13 < pAggInfo->nAccumulator);
  }
  pAggInfo->directMode = '\0';
  if (iVar12 != 0) {
    if (p->nOp + -1 == iVar12) {
      p->nOp = iVar12;
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar5 = p->aOp + iVar12;
      }
      else {
        pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar5->p2 = p->nOp;
    }
  }
  return;
}

Assistant:

static void updateAccumulator(
  Parse *pParse,
  int regAcc,
  AggInfo *pAggInfo,
  int eDistinctType
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  assert( pAggInfo->iFirstReg>0 );
  if( pParse->nErr ) return;
  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    int regAggSz = 0;
    int regDistinct = 0;
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    assert( !IsWindowFunc(pF->pFExpr) );
    assert( pF->pFunc!=0 );
    pList = pF->pFExpr->x.pList;
    if( ExprHasProperty(pF->pFExpr, EP_WinFunc) ){
      Expr *pFilter = pF->pFExpr->y.pWin->pFilter;
      if( pAggInfo->nAccumulator
       && (pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)
       && regAcc
      ){
        /* If regAcc==0, there there exists some min() or max() function
        ** without a FILTER clause that will ensure the magnet registers
        ** are populated. */
        if( regHit==0 ) regHit = ++pParse->nMem;
        /* If this is the first row of the group (regAcc contains 0), clear the
        ** "magnet" register regHit so that the accumulator registers
        ** are populated if the FILTER clause jumps over the the
        ** invocation of min() or max() altogether. Or, if this is not
        ** the first row (regAcc contains 1), set the magnet register so that
        ** the accumulators are not populated unless the min()/max() is invoked
        ** and indicates that they should be.  */
        sqlite3VdbeAddOp2(v, OP_Copy, regAcc, regHit);
      }
      addrNext = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse, pFilter, addrNext, SQLITE_JUMPIFNULL);
    }
    if( pF->iOBTab>=0 ){
      /* Instead of invoking AggStep, we must push the arguments that would
      ** have been passed to AggStep onto the sorting table. */
      int jj;                /* Registered used so far in building the record */
      ExprList *pOBList;     /* The ORDER BY clause */
      assert( pList!=0 );
      nArg = pList->nExpr;
      assert( nArg>0 );
      assert( pF->pFExpr->pLeft!=0 );
      assert( pF->pFExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pF->pFExpr->pLeft) );
      pOBList = pF->pFExpr->pLeft->x.pList;
      assert( pOBList!=0 );
      assert( pOBList->nExpr>0 );
      regAggSz = pOBList->nExpr;
      if( !pF->bOBUnique ){
        regAggSz++;   /* One register for OP_Sequence */
      }
      if( pF->bOBPayload ){
        regAggSz += nArg;
      }
      if( pF->bUseSubtype ){
        regAggSz += nArg;
      }
      regAggSz++;  /* One extra register to hold result of MakeRecord */
      regAgg = sqlite3GetTempRange(pParse, regAggSz);
      regDistinct = regAgg;
      sqlite3ExprCodeExprList(pParse, pOBList, regAgg, 0, SQLITE_ECEL_DUP);
      jj = pOBList->nExpr;
      if( !pF->bOBUnique ){
        sqlite3VdbeAddOp2(v, OP_Sequence, pF->iOBTab, regAgg+jj);
        jj++;
      }
      if( pF->bOBPayload ){
        regDistinct = regAgg+jj;
        sqlite3ExprCodeExprList(pParse, pList, regDistinct, 0, SQLITE_ECEL_DUP);
        jj += nArg;
      }
      if( pF->bUseSubtype ){
        int kk;
        int regBase = pF->bOBPayload ? regDistinct : regAgg;
        for(kk=0; kk<nArg; kk++, jj++){
          sqlite3VdbeAddOp2(v, OP_GetSubtype, regBase+kk, regAgg+jj);
        }
      }
    }else if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      regDistinct = regAgg;
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 && pList ){
      if( addrNext==0 ){
        addrNext = sqlite3VdbeMakeLabel(pParse);
      }
      pF->iDistinct = codeDistinct(pParse, eDistinctType,
          pF->iDistinct, addrNext, pList, regDistinct);
    }
    if( pF->iOBTab>=0 ){
      /* Insert a new record into the ORDER BY table */
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regAgg, regAggSz-1,
                        regAgg+regAggSz-1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pF->iOBTab, regAgg+regAggSz-1,
                           regAgg, regAggSz-1);
      sqlite3ReleaseTempRange(pParse, regAgg, regAggSz);
    }else{
      /* Invoke the AggStep function */
      if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl = 0;
        struct ExprList_item *pItem;
        int j;
        assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
        for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
          pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
        }
        if( !pColl ){
          pColl = pParse->db->pDfltColl;
        }
        if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
        sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0,
                         (char *)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
    if( pParse->nErr ) return;
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pCExpr, AggInfoColumnReg(pAggInfo,i));
    if( pParse->nErr ) return;
  }

  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHereOrPopInst(v, addrHitTest);
  }
}